

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O0

void generateMipmaps(ktxVulkanTexture *vkTexture,ktxVulkanDeviceInfo *vdi,VkFilter blitFilter,
                    VkImageLayout initialLayout)

{
  byte bVar1;
  ktxVulkanFunctions vkFuncs;
  ktxVulkanFunctions vkFuncs_00;
  ktxVulkanFunctions vkFuncs_01;
  ktxVulkanFunctions vkFuncs_02;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  VkImageSubresourceRange subresourceRange_03;
  long lVar2;
  undefined4 in_EDX;
  long in_RSI;
  undefined8 *puVar3;
  long in_RDI;
  undefined1 **ppuVar4;
  byte bVar5;
  VkImageSubresourceRange mipSubRange;
  VkImageBlit imageBlit;
  uint32_t i;
  VkImageSubresourceRange subresourceRange;
  undefined1 *local_208;
  undefined4 local_200;
  VkImageLayout in_stack_fffffffffffffe80;
  VkImageLayout in_stack_fffffffffffffe84;
  VkImage in_stack_fffffffffffffe88;
  VkCommandBuffer in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffea0 [72];
  undefined1 in_stack_fffffffffffffefc [12];
  undefined8 in_stack_ffffffffffffff08;
  undefined8 uVar6;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 uVar7;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 uVar8;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint32_t in_stack_ffffffffffffffa0;
  uint local_34;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined4 local_20;
  undefined4 local_14;
  long local_10;
  long local_8;
  
  bVar5 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_30,0,0x14);
  local_30 = 1;
  uStack_2c = 0;
  uStack_28 = 1;
  uStack_24 = 0;
  local_20 = *(undefined4 *)(local_8 + 0x3c);
  uVar10 = *(undefined8 *)(local_10 + 0x20);
  uVar9 = *(undefined8 *)(local_8 + 0x10);
  puVar3 = (undefined8 *)(local_10 + 0x240);
  ppuVar4 = &local_208;
  for (lVar2 = 0x1e; lVar2 != 0; lVar2 = lVar2 + -1) {
    *ppuVar4 = (undefined1 *)*puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    ppuVar4 = ppuVar4 + (ulong)bVar5 * -2 + 1;
  }
  vkFuncs.vkCmdPipelineBarrier._4_4_ = uStack_2c;
  vkFuncs.vkCmdPipelineBarrier._0_4_ = local_30;
  vkFuncs.vkCreateImage._4_4_ = uStack_24;
  vkFuncs.vkCreateImage._0_4_ = uStack_28;
  vkFuncs.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)in_stack_fffffffffffffea0._0_8_;
  vkFuncs.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffea0._8_8_;
  vkFuncs.vkAllocateCommandBuffers = (PFN_vkAllocateCommandBuffers)in_stack_fffffffffffffea0._16_8_;
  vkFuncs.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffea0._24_8_;
  vkFuncs.vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffea0._32_8_;
  vkFuncs.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffea0._40_8_;
  vkFuncs.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffea0._48_8_;
  vkFuncs.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffea0._56_8_;
  vkFuncs.vkCmdCopyBufferToImage = (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffea0._64_8_;
  vkFuncs.vkDestroyImage._0_4_ = local_20;
  vkFuncs._92_12_ = in_stack_fffffffffffffefc;
  vkFuncs.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_ffffffffffffff08;
  vkFuncs.vkCreateFence = (PFN_vkCreateFence)in_stack_ffffffffffffff10;
  vkFuncs.vkDestroyFence._0_4_ = in_stack_ffffffffffffff18;
  vkFuncs.vkDestroyFence._4_4_ = in_stack_ffffffffffffff1c;
  vkFuncs.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_ffffffffffffff20;
  vkFuncs.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)in_stack_ffffffffffffff28;
  vkFuncs.vkFreeMemory = (PFN_vkFreeMemory)in_stack_ffffffffffffff30;
  vkFuncs.vkGetBufferMemoryRequirements =
       (PFN_vkGetBufferMemoryRequirements)in_stack_ffffffffffffff38;
  vkFuncs.vkGetImageMemoryRequirements._0_4_ = in_stack_ffffffffffffff40;
  vkFuncs.vkGetImageMemoryRequirements._4_4_ = in_stack_ffffffffffffff44;
  vkFuncs.vkGetImageSubresourceLayout._0_4_ = in_stack_ffffffffffffff48;
  vkFuncs.vkGetImageSubresourceLayout._4_4_ = in_stack_ffffffffffffff4c;
  vkFuncs.vkGetPhysicalDeviceImageFormatProperties._0_4_ = in_stack_ffffffffffffff50;
  vkFuncs.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_ffffffffffffff54;
  vkFuncs.vkGetPhysicalDeviceFormatProperties = (PFN_vkGetPhysicalDeviceFormatProperties)uVar9;
  vkFuncs.vkGetPhysicalDeviceMemoryProperties = (PFN_vkGetPhysicalDeviceMemoryProperties)uVar10;
  vkFuncs.vkMapMemory._0_4_ = in_stack_ffffffffffffff68;
  vkFuncs.vkMapMemory._4_4_ = in_stack_ffffffffffffff6c;
  vkFuncs.vkQueueSubmit._0_4_ = in_stack_ffffffffffffff70;
  vkFuncs.vkQueueSubmit._4_4_ = in_stack_ffffffffffffff74;
  vkFuncs.vkQueueWaitIdle._0_4_ = in_stack_ffffffffffffff78;
  vkFuncs.vkQueueWaitIdle._4_4_ = in_stack_ffffffffffffff7c;
  vkFuncs.vkUnmapMemory._0_4_ = in_stack_ffffffffffffff80;
  vkFuncs.vkUnmapMemory._4_4_ = in_stack_ffffffffffffff84;
  vkFuncs.vkWaitForFences._0_4_ = in_stack_ffffffffffffff88;
  vkFuncs.vkWaitForFences._4_4_ = in_stack_ffffffffffffff8c;
  subresourceRange_00.levelCount = in_stack_ffffffffffffff98;
  subresourceRange_00.aspectMask = (int)in_stack_ffffffffffffff90;
  subresourceRange_00.baseMipLevel = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  subresourceRange_00.baseArrayLayer = in_stack_ffffffffffffff9c;
  subresourceRange_00.layerCount = in_stack_ffffffffffffffa0;
  setImageLayout(vkFuncs,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,subresourceRange_00);
  for (local_34 = 1; local_34 < *(uint *)(local_8 + 0x38); local_34 = local_34 + 1) {
    memset(&stack0xffffffffffffff7c,0,0x50);
    in_stack_ffffffffffffff7c = 1;
    in_stack_ffffffffffffff88 = *(undefined4 *)(local_8 + 0x3c);
    in_stack_ffffffffffffff80 = local_34 - 1;
    bVar1 = (byte)local_34;
    if (*(uint *)(local_8 + 0x2c) >> (bVar1 - 1 & 0x1f) == 0) {
      in_stack_ffffffffffffff54 = 1;
    }
    else {
      in_stack_ffffffffffffff54 = *(uint *)(local_8 + 0x2c) >> (bVar1 - 1 & 0x1f);
    }
    if (*(uint *)(local_8 + 0x30) >> (bVar1 - 1 & 0x1f) == 0) {
      in_stack_ffffffffffffff50 = 1;
    }
    else {
      in_stack_ffffffffffffff50 = *(uint *)(local_8 + 0x30) >> (bVar1 - 1 & 0x1f);
    }
    if (*(uint *)(local_8 + 0x34) >> (bVar1 - 1 & 0x1f) == 0) {
      in_stack_ffffffffffffff4c = 1;
    }
    else {
      in_stack_ffffffffffffff4c = *(uint *)(local_8 + 0x34) >> (bVar1 - 1 & 0x1f);
    }
    if (*(uint *)(local_8 + 0x2c) >> (bVar1 & 0x1f) == 0) {
      in_stack_ffffffffffffff48 = 1;
    }
    else {
      in_stack_ffffffffffffff48 = *(uint *)(local_8 + 0x2c) >> (bVar1 & 0x1f);
    }
    if (*(uint *)(local_8 + 0x30) >> (bVar1 & 0x1f) == 0) {
      in_stack_ffffffffffffff44 = 1;
    }
    else {
      in_stack_ffffffffffffff44 = *(uint *)(local_8 + 0x30) >> (bVar1 & 0x1f);
    }
    if (*(uint *)(local_8 + 0x34) >> (bVar1 & 0x1f) == 0) {
      in_stack_ffffffffffffff40 = 1;
    }
    else {
      in_stack_ffffffffffffff40 = *(uint *)(local_8 + 0x34) >> (bVar1 & 0x1f);
    }
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffff54;
    in_stack_ffffffffffffff9c = in_stack_ffffffffffffff50;
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff4c;
    memset(&stack0xffffffffffffff68,0,0x14);
    in_stack_ffffffffffffff68 = 1;
    in_stack_ffffffffffffff70 = 1;
    in_stack_ffffffffffffff78 = *(undefined4 *)(local_8 + 0x3c);
    in_stack_ffffffffffffff28 = *(undefined8 *)(local_10 + 0x20);
    in_stack_ffffffffffffff20 = *(undefined8 *)(local_8 + 0x10);
    puVar3 = (undefined8 *)(local_10 + 0x240);
    ppuVar4 = &local_208;
    in_stack_ffffffffffffff6c = local_34;
    for (lVar2 = 0x1e; lVar2 != 0; lVar2 = lVar2 + -1) {
      *ppuVar4 = (undefined1 *)*puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      ppuVar4 = ppuVar4 + (ulong)bVar5 * -2 + 1;
    }
    vkFuncs_00.vkCmdPipelineBarrier._4_4_ = in_stack_ffffffffffffff6c;
    vkFuncs_00.vkCmdPipelineBarrier._0_4_ = in_stack_ffffffffffffff68;
    vkFuncs_00.vkCreateImage._4_4_ = in_stack_ffffffffffffff74;
    vkFuncs_00.vkCreateImage._0_4_ = in_stack_ffffffffffffff70;
    vkFuncs_00.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)in_stack_fffffffffffffea0._0_8_;
    vkFuncs_00.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffea0._8_8_;
    vkFuncs_00.vkAllocateCommandBuffers =
         (PFN_vkAllocateCommandBuffers)in_stack_fffffffffffffea0._16_8_;
    vkFuncs_00.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffea0._24_8_;
    vkFuncs_00.vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffea0._32_8_;
    vkFuncs_00.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffea0._40_8_;
    vkFuncs_00.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffea0._48_8_;
    vkFuncs_00.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffea0._56_8_;
    vkFuncs_00.vkCmdCopyBufferToImage = (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffea0._64_8_
    ;
    vkFuncs_00.vkDestroyImage._0_4_ = in_stack_ffffffffffffff78;
    vkFuncs_00._92_12_ = in_stack_fffffffffffffefc;
    vkFuncs_00.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_ffffffffffffff08;
    vkFuncs_00.vkCreateFence = (PFN_vkCreateFence)in_stack_ffffffffffffff10;
    vkFuncs_00.vkDestroyFence._0_4_ = in_stack_ffffffffffffff18;
    vkFuncs_00.vkDestroyFence._4_4_ = in_stack_ffffffffffffff1c;
    vkFuncs_00.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_ffffffffffffff20;
    vkFuncs_00.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)in_stack_ffffffffffffff28;
    vkFuncs_00.vkFreeMemory = (PFN_vkFreeMemory)in_stack_ffffffffffffff30;
    vkFuncs_00.vkGetBufferMemoryRequirements =
         (PFN_vkGetBufferMemoryRequirements)in_stack_ffffffffffffff38;
    vkFuncs_00.vkGetImageMemoryRequirements._0_4_ = in_stack_ffffffffffffff40;
    vkFuncs_00.vkGetImageMemoryRequirements._4_4_ = in_stack_ffffffffffffff44;
    vkFuncs_00.vkGetImageSubresourceLayout._0_4_ = in_stack_ffffffffffffff48;
    vkFuncs_00.vkGetImageSubresourceLayout._4_4_ = in_stack_ffffffffffffff4c;
    vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties._0_4_ = in_stack_ffffffffffffff50;
    vkFuncs_00.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_ffffffffffffff54;
    vkFuncs_00.vkGetPhysicalDeviceFormatProperties = (PFN_vkGetPhysicalDeviceFormatProperties)uVar9;
    vkFuncs_00.vkGetPhysicalDeviceMemoryProperties = (PFN_vkGetPhysicalDeviceMemoryProperties)uVar10
    ;
    vkFuncs_00.vkMapMemory._0_4_ = in_stack_ffffffffffffff68;
    vkFuncs_00.vkMapMemory._4_4_ = in_stack_ffffffffffffff6c;
    vkFuncs_00.vkQueueSubmit._0_4_ = in_stack_ffffffffffffff70;
    vkFuncs_00.vkQueueSubmit._4_4_ = in_stack_ffffffffffffff74;
    vkFuncs_00.vkQueueWaitIdle._0_4_ = in_stack_ffffffffffffff78;
    vkFuncs_00.vkQueueWaitIdle._4_4_ = in_stack_ffffffffffffff7c;
    vkFuncs_00.vkUnmapMemory._0_4_ = in_stack_ffffffffffffff80;
    vkFuncs_00.vkUnmapMemory._4_4_ = in_stack_ffffffffffffff84;
    vkFuncs_00.vkWaitForFences._0_4_ = in_stack_ffffffffffffff88;
    vkFuncs_00.vkWaitForFences._4_4_ = in_stack_ffffffffffffff8c;
    subresourceRange_01.levelCount = in_stack_ffffffffffffff98;
    subresourceRange_01.aspectMask = (int)in_stack_ffffffffffffff90;
    subresourceRange_01.baseMipLevel = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    subresourceRange_01.baseArrayLayer = in_stack_ffffffffffffff9c;
    subresourceRange_01.layerCount = in_stack_ffffffffffffffa0;
    setImageLayout(vkFuncs_00,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,subresourceRange_01);
    local_208 = &stack0xffffffffffffff7c;
    local_200 = local_14;
    (**(code **)(local_10 + 0x278))
              (*(undefined8 *)(local_10 + 0x20),*(undefined8 *)(local_8 + 0x10),6,
               *(undefined8 *)(local_8 + 0x10),7,1);
    in_stack_ffffffffffffff38 = *(undefined8 *)(local_10 + 0x20);
    in_stack_ffffffffffffff30 = *(undefined8 *)(local_8 + 0x10);
    puVar3 = (undefined8 *)(local_10 + 0x240);
    ppuVar4 = &local_208;
    for (lVar2 = 0x1e; lVar2 != 0; lVar2 = lVar2 + -1) {
      *ppuVar4 = (undefined1 *)*puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      ppuVar4 = ppuVar4 + (ulong)bVar5 * -2 + 1;
    }
    vkFuncs_01.vkCmdPipelineBarrier._4_4_ = in_stack_ffffffffffffff6c;
    vkFuncs_01.vkCmdPipelineBarrier._0_4_ = in_stack_ffffffffffffff68;
    vkFuncs_01.vkCreateImage._4_4_ = in_stack_ffffffffffffff74;
    vkFuncs_01.vkCreateImage._0_4_ = in_stack_ffffffffffffff70;
    vkFuncs_01.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)in_stack_fffffffffffffea0._0_8_;
    vkFuncs_01.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffea0._8_8_;
    vkFuncs_01.vkAllocateCommandBuffers =
         (PFN_vkAllocateCommandBuffers)in_stack_fffffffffffffea0._16_8_;
    vkFuncs_01.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffea0._24_8_;
    vkFuncs_01.vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffea0._32_8_;
    vkFuncs_01.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffea0._40_8_;
    vkFuncs_01.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffea0._48_8_;
    vkFuncs_01.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffea0._56_8_;
    vkFuncs_01.vkCmdCopyBufferToImage = (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffea0._64_8_
    ;
    vkFuncs_01.vkDestroyImage._0_4_ = in_stack_ffffffffffffff78;
    vkFuncs_01._92_12_ = in_stack_fffffffffffffefc;
    vkFuncs_01.vkDestroyBuffer = (PFN_vkDestroyBuffer)in_stack_ffffffffffffff08;
    vkFuncs_01.vkCreateFence = (PFN_vkCreateFence)in_stack_ffffffffffffff10;
    vkFuncs_01.vkDestroyFence._0_4_ = in_stack_ffffffffffffff18;
    vkFuncs_01.vkDestroyFence._4_4_ = in_stack_ffffffffffffff1c;
    vkFuncs_01.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_ffffffffffffff20;
    vkFuncs_01.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)in_stack_ffffffffffffff28;
    vkFuncs_01.vkFreeMemory = (PFN_vkFreeMemory)in_stack_ffffffffffffff30;
    vkFuncs_01.vkGetBufferMemoryRequirements =
         (PFN_vkGetBufferMemoryRequirements)in_stack_ffffffffffffff38;
    vkFuncs_01.vkGetImageMemoryRequirements._0_4_ = in_stack_ffffffffffffff40;
    vkFuncs_01.vkGetImageMemoryRequirements._4_4_ = in_stack_ffffffffffffff44;
    vkFuncs_01.vkGetImageSubresourceLayout._0_4_ = in_stack_ffffffffffffff48;
    vkFuncs_01.vkGetImageSubresourceLayout._4_4_ = in_stack_ffffffffffffff4c;
    vkFuncs_01.vkGetPhysicalDeviceImageFormatProperties._0_4_ = in_stack_ffffffffffffff50;
    vkFuncs_01.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_ffffffffffffff54;
    vkFuncs_01.vkGetPhysicalDeviceFormatProperties = (PFN_vkGetPhysicalDeviceFormatProperties)uVar9;
    vkFuncs_01.vkGetPhysicalDeviceMemoryProperties = (PFN_vkGetPhysicalDeviceMemoryProperties)uVar10
    ;
    vkFuncs_01.vkMapMemory._0_4_ = in_stack_ffffffffffffff68;
    vkFuncs_01.vkMapMemory._4_4_ = in_stack_ffffffffffffff6c;
    vkFuncs_01.vkQueueSubmit._0_4_ = in_stack_ffffffffffffff70;
    vkFuncs_01.vkQueueSubmit._4_4_ = in_stack_ffffffffffffff74;
    vkFuncs_01.vkQueueWaitIdle._0_4_ = in_stack_ffffffffffffff78;
    vkFuncs_01.vkQueueWaitIdle._4_4_ = in_stack_ffffffffffffff7c;
    vkFuncs_01.vkUnmapMemory._0_4_ = in_stack_ffffffffffffff80;
    vkFuncs_01.vkUnmapMemory._4_4_ = in_stack_ffffffffffffff84;
    vkFuncs_01.vkWaitForFences._0_4_ = in_stack_ffffffffffffff88;
    vkFuncs_01.vkWaitForFences._4_4_ = in_stack_ffffffffffffff8c;
    subresourceRange_02.levelCount = in_stack_ffffffffffffff98;
    subresourceRange_02.aspectMask = (int)in_stack_ffffffffffffff90;
    subresourceRange_02.baseMipLevel = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
    subresourceRange_02.baseArrayLayer = in_stack_ffffffffffffff9c;
    subresourceRange_02.layerCount = in_stack_ffffffffffffffa0;
    setImageLayout(vkFuncs_01,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,subresourceRange_02);
  }
  uStack_28 = *(undefined4 *)(local_8 + 0x38);
  uVar7 = *(undefined8 *)(local_10 + 0x20);
  uVar6 = *(undefined8 *)(local_8 + 0x10);
  uVar8 = *(undefined4 *)(local_8 + 0x1c);
  puVar3 = (undefined8 *)(local_10 + 0x240);
  ppuVar4 = &local_208;
  for (lVar2 = 0x1e; lVar2 != 0; lVar2 = lVar2 + -1) {
    *ppuVar4 = (undefined1 *)*puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    ppuVar4 = ppuVar4 + (ulong)bVar5 * -2 + 1;
  }
  vkFuncs_02.vkCmdPipelineBarrier._4_4_ = uStack_2c;
  vkFuncs_02.vkCmdPipelineBarrier._0_4_ = local_30;
  vkFuncs_02.vkCreateImage._4_4_ = uStack_24;
  vkFuncs_02.vkCreateImage._0_4_ = uStack_28;
  vkFuncs_02.vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)in_stack_fffffffffffffea0._0_8_;
  vkFuncs_02.vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)in_stack_fffffffffffffea0._8_8_;
  vkFuncs_02.vkAllocateCommandBuffers =
       (PFN_vkAllocateCommandBuffers)in_stack_fffffffffffffea0._16_8_;
  vkFuncs_02.vkAllocateMemory = (PFN_vkAllocateMemory)in_stack_fffffffffffffea0._24_8_;
  vkFuncs_02.vkBeginCommandBuffer = (PFN_vkBeginCommandBuffer)in_stack_fffffffffffffea0._32_8_;
  vkFuncs_02.vkBindBufferMemory = (PFN_vkBindBufferMemory)in_stack_fffffffffffffea0._40_8_;
  vkFuncs_02.vkBindImageMemory = (PFN_vkBindImageMemory)in_stack_fffffffffffffea0._48_8_;
  vkFuncs_02.vkCmdBlitImage = (PFN_vkCmdBlitImage)in_stack_fffffffffffffea0._56_8_;
  vkFuncs_02.vkCmdCopyBufferToImage = (PFN_vkCmdCopyBufferToImage)in_stack_fffffffffffffea0._64_8_;
  vkFuncs_02.vkDestroyImage._0_4_ = local_20;
  vkFuncs_02._92_12_ = in_stack_fffffffffffffefc;
  vkFuncs_02.vkDestroyBuffer = (PFN_vkDestroyBuffer)uVar6;
  vkFuncs_02.vkCreateFence = (PFN_vkCreateFence)uVar7;
  vkFuncs_02.vkDestroyFence._0_4_ = in_stack_ffffffffffffff18;
  vkFuncs_02.vkDestroyFence._4_4_ = uVar8;
  vkFuncs_02.vkEndCommandBuffer = (PFN_vkEndCommandBuffer)in_stack_ffffffffffffff20;
  vkFuncs_02.vkFreeCommandBuffers = (PFN_vkFreeCommandBuffers)in_stack_ffffffffffffff28;
  vkFuncs_02.vkFreeMemory = (PFN_vkFreeMemory)in_stack_ffffffffffffff30;
  vkFuncs_02.vkGetBufferMemoryRequirements =
       (PFN_vkGetBufferMemoryRequirements)in_stack_ffffffffffffff38;
  vkFuncs_02.vkGetImageMemoryRequirements._0_4_ = in_stack_ffffffffffffff40;
  vkFuncs_02.vkGetImageMemoryRequirements._4_4_ = in_stack_ffffffffffffff44;
  vkFuncs_02.vkGetImageSubresourceLayout._0_4_ = in_stack_ffffffffffffff48;
  vkFuncs_02.vkGetImageSubresourceLayout._4_4_ = in_stack_ffffffffffffff4c;
  vkFuncs_02.vkGetPhysicalDeviceImageFormatProperties._0_4_ = in_stack_ffffffffffffff50;
  vkFuncs_02.vkGetPhysicalDeviceImageFormatProperties._4_4_ = in_stack_ffffffffffffff54;
  vkFuncs_02.vkGetPhysicalDeviceFormatProperties = (PFN_vkGetPhysicalDeviceFormatProperties)uVar9;
  vkFuncs_02.vkGetPhysicalDeviceMemoryProperties = (PFN_vkGetPhysicalDeviceMemoryProperties)uVar10;
  vkFuncs_02.vkMapMemory._0_4_ = in_stack_ffffffffffffff68;
  vkFuncs_02.vkMapMemory._4_4_ = in_stack_ffffffffffffff6c;
  vkFuncs_02.vkQueueSubmit._0_4_ = in_stack_ffffffffffffff70;
  vkFuncs_02.vkQueueSubmit._4_4_ = in_stack_ffffffffffffff74;
  vkFuncs_02.vkQueueWaitIdle._0_4_ = in_stack_ffffffffffffff78;
  vkFuncs_02.vkQueueWaitIdle._4_4_ = in_stack_ffffffffffffff7c;
  vkFuncs_02.vkUnmapMemory._0_4_ = in_stack_ffffffffffffff80;
  vkFuncs_02.vkUnmapMemory._4_4_ = in_stack_ffffffffffffff84;
  vkFuncs_02.vkWaitForFences._0_4_ = in_stack_ffffffffffffff88;
  vkFuncs_02.vkWaitForFences._4_4_ = in_stack_ffffffffffffff8c;
  subresourceRange_03.levelCount = in_stack_ffffffffffffff98;
  subresourceRange_03.aspectMask = (int)in_stack_ffffffffffffff90;
  subresourceRange_03.baseMipLevel = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  subresourceRange_03.baseArrayLayer = in_stack_ffffffffffffff9c;
  subresourceRange_03.layerCount = in_stack_ffffffffffffffa0;
  setImageLayout(vkFuncs_02,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,subresourceRange_03);
  return;
}

Assistant:

static void
generateMipmaps(ktxVulkanTexture* vkTexture, ktxVulkanDeviceInfo* vdi,
                VkFilter blitFilter, VkImageLayout initialLayout)
{
    VkImageSubresourceRange subresourceRange;
    memset(&subresourceRange, 0, sizeof(subresourceRange));
    subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    subresourceRange.baseMipLevel = 0;
    subresourceRange.levelCount = 1;
    subresourceRange.baseArrayLayer = 0;
    subresourceRange.layerCount = vkTexture->layerCount;

    // Transition base level to SRC_OPTIMAL for blitting.
    setImageLayout(
        vdi->vkFuncs,
        vdi->cmdBuffer,
        vkTexture->image,
        initialLayout,
        VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
        subresourceRange);

    // Generate the mip chain
    // ----------------------
    // Blit level n from level n-1.
    for (uint32_t i = 1; i < vkTexture->levelCount; i++)
    {
        VkImageBlit imageBlit;
        memset(&imageBlit, 0, sizeof(imageBlit));

        // Source
        imageBlit.srcSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        imageBlit.srcSubresource.layerCount = vkTexture->layerCount;
        imageBlit.srcSubresource.mipLevel = i-1;
        imageBlit.srcOffsets[1].x = MAX(1, vkTexture->width >> (i - 1));
        imageBlit.srcOffsets[1].y = MAX(1, vkTexture->height >> (i - 1));
        imageBlit.srcOffsets[1].z = MAX(1, vkTexture->depth >> (i - 1));;

        // Destination
        imageBlit.dstSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        imageBlit.dstSubresource.layerCount = 1;
        imageBlit.dstSubresource.mipLevel = i;
        imageBlit.dstOffsets[1].x = MAX(1, vkTexture->width >> i);
        imageBlit.dstOffsets[1].y = MAX(1, vkTexture->height >> i);
        imageBlit.dstOffsets[1].z = MAX(1, vkTexture->depth >> i);

        VkImageSubresourceRange mipSubRange;
        memset(&mipSubRange, 0, sizeof(mipSubRange));

        mipSubRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        mipSubRange.baseMipLevel = i;
        mipSubRange.levelCount = 1;
        mipSubRange.layerCount = vkTexture->layerCount;

        // Transiton current mip level to transfer dest
        setImageLayout(
            vdi->vkFuncs,
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_UNDEFINED,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            mipSubRange);

        // Blit from previous level
        vdi->vkFuncs.vkCmdBlitImage(
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
            vkTexture->image,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            1,
            &imageBlit,
            blitFilter);

        // Transiton current mip level to transfer source for read in
        // next iteration.
        setImageLayout(
            vdi->vkFuncs,
            vdi->cmdBuffer,
            vkTexture->image,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
            VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
            mipSubRange);
    }

    // After the loop, all mip layers are in TRANSFER_SRC layout.
    // Transition all to final layout.
    subresourceRange.levelCount = vkTexture->levelCount;
    setImageLayout(
        vdi->vkFuncs,
        vdi->cmdBuffer,
        vkTexture->image,
        VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
        vkTexture->imageLayout,
        subresourceRange);
}